

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void store_stock_list(store *store,object **list,wchar_t n)

{
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  int local_3c;
  _Bool possible;
  object *poStack_38;
  wchar_t i;
  object *first;
  object *current;
  wchar_t num;
  wchar_t list_num;
  _Bool not_home;
  wchar_t n_local;
  object **list_local;
  store *store_local;
  
  _Var2 = store_is_home(store);
  current._0_4_ = 0;
  for (current._4_4_ = L'\0'; current._4_4_ < n; current._4_4_ = current._4_4_ + L'\x01') {
    poStack_38 = (object *)0x0;
    for (first = store->stock; first != (object *)0x0; first = first->next) {
      bVar1 = true;
      for (local_3c = 0; local_3c < (int)current; local_3c = local_3c + 1) {
        if (list[local_3c] == first) {
          bVar1 = false;
        }
      }
      if ((bVar1) && (_Var3 = earlier_object(poStack_38,first,!_Var2), _Var3)) {
        poStack_38 = first;
      }
    }
    list[current._4_4_] = poStack_38;
    if (poStack_38 != (object *)0x0) {
      current._0_4_ = (int)current + 1;
    }
  }
  return;
}

Assistant:

void store_stock_list(struct store *store, struct object **list, int n)
{
	bool not_home = store_is_home(store) ? false : true;
	int list_num;
	int num = 0;

	for (list_num = 0; list_num < n; list_num++) {
		struct object *current, *first = NULL;
		for (current = store->stock; current; current = current->next) {
			int i;
			bool possible = true;

			/* Skip objects already allocated */
			for (i = 0; i < num; i++)
				if (list[i] == current)
					possible = false;

			/* If still possible, choose the first in order */
			if (!possible)
				continue;
			else if (earlier_object(first, current, not_home))
				first = current;
		}

		/* Allocate and count the stock */
		list[list_num] = first;
		if (first)
			num++;
	}
}